

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbistbl.cpp
# Opt level: O0

RBBINode * __thiscall icu_63::RBBISymbolTable::lookupNode(RBBISymbolTable *this,UnicodeString *key)

{
  void *pvVar1;
  RBBISymbolTableEntry *el;
  RBBINode *retNode;
  UnicodeString *key_local;
  RBBISymbolTable *this_local;
  
  el = (RBBISymbolTableEntry *)0x0;
  pvVar1 = uhash_get_63(this->fHashTable,key);
  if (pvVar1 != (void *)0x0) {
    el = *(RBBISymbolTableEntry **)((long)pvVar1 + 0x48);
  }
  return (RBBINode *)el;
}

Assistant:

RBBINode       *RBBISymbolTable::lookupNode(const UnicodeString &key) const{

    RBBINode             *retNode = NULL;
    RBBISymbolTableEntry *el;

    el = (RBBISymbolTableEntry *)uhash_get(fHashTable, &key);
    if (el != NULL) {
        retNode = el->val;
    }
    return retNode;
}